

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hrtime.c
# Opt level: O0

int run_test_hrtime(void)

{
  uint64_t uVar1;
  uint64_t uVar2;
  int local_24;
  int i;
  uint64_t diff;
  uint64_t b;
  uint64_t a;
  
  local_24 = 0x4b;
  while( true ) {
    if (local_24 < 1) {
      return 0;
    }
    uVar1 = uv_hrtime();
    uv_sleep(0x2d);
    uVar2 = uv_hrtime();
    if (uVar2 - uVar1 < 0x17d7841) break;
    local_24 = local_24 + -1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-hrtime.c"
          ,0x30,"diff > (uint64_t) 25 * NANOSEC / MILLISEC");
  abort();
}

Assistant:

TEST_IMPL(hrtime) {
  uint64_t a, b, diff;
  int i = 75;
  while (i > 0) {
    a = uv_hrtime();
    uv_sleep(45);
    b = uv_hrtime();

    diff = b - a;

    /* The windows Sleep() function has only a resolution of 10-20 ms. Check
     * that the difference between the two hrtime values has a reasonable
     * lower bound.
     */
    ASSERT(diff > (uint64_t) 25 * NANOSEC / MILLISEC);
    --i;
  }
  return 0;
}